

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O3

string * __thiscall
viennamath::rt_latex_constant_processor<viennamath::rt_expression_interface<double>>::
process_impl_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Constant *e,bool param_2,
          rt_latex_translator<viennamath::rt_expression_interface<double>_> *param_3)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190," ",1);
  poVar1 = std::ostream::_M_insert<double>(e->s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string process_impl(Constant const & e, bool /*use_parenthesis*/, rt_latex_translator<InterfaceType> const & /*translator*/) const
      {
        std::stringstream ss;
        ss << " " << static_cast<NumericType>(e) << " ";
        return ss.str();
      }